

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-debugchannel.c
# Opt level: O0

int lread(lua_State *L)

{
  undefined8 *puVar1;
  stm_copy *copy_00;
  stm_copy *copy;
  boxreader *box;
  lua_State *L_local;
  
  puVar1 = (undefined8 *)lua_touserdata(L,1);
  luaL_checktype(L,2,6);
  copy_00 = stm_copy((stm_object *)*puVar1);
  if (copy_00 == (stm_copy *)puVar1[1]) {
    stm_releasecopy(copy_00);
    lua_pushboolean(L,0);
    L_local._4_4_ = 1;
  }
  else {
    stm_releasecopy((stm_copy *)puVar1[1]);
    puVar1[1] = copy_00;
    if (copy_00 == (stm_copy *)0x0) {
      lua_pushboolean(L,0);
      L_local._4_4_ = 1;
    }
    else {
      lua_settop(L,3);
      lua_copy(L,-1,1);
      lua_settop(L,-2);
      lua_settop(L,2);
      lua_pushlightuserdata(L,copy_00->msg);
      lua_pushinteger(L,(ulong)copy_00->sz);
      lua_pushvalue(L,1);
      lua_callk(L,3,-1,0,(lua_KFunction)0x0);
      lua_pushboolean(L,1);
      lua_copy(L,-1,1);
      lua_settop(L,-2);
      L_local._4_4_ = lua_gettop(L);
    }
  }
  return L_local._4_4_;
}

Assistant:

static int
lread(lua_State *L) {
	struct channel_box *cb = luaL_checkudata(L,1, METANAME);
	double ti = luaL_optnumber(L, 2, 0);
	struct command * c = channel_read(cb->c, ti);
	if (c == NULL)
		return 0;
	lua_pushlstring(L, (const char *)(c+1), c->sz);
	free(c);
	return 1;
}